

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-utf8.cc
# Opt level: O0

void anon_unknown.dwarf_85c4f::assert_is_valid_utf8
               (bool expected,int length,int cu0,int cu1,int cu2,int cu3)

{
  bool bVar1;
  bool bVar2;
  Message *pMVar3;
  char *pcVar4;
  undefined4 in_register_0000008c;
  string local_c0;
  AssertHelper local_a0;
  Message local_98;
  bool local_89;
  undefined1 local_88 [8];
  AssertionResult gtest_ar__1;
  string local_70;
  AssertHelper local_50;
  Message local_48;
  bool local_39;
  undefined1 local_38 [8];
  AssertionResult gtest_ar_;
  int bad_length;
  char buf [4];
  int cu3_local;
  int cu2_local;
  int cu1_local;
  int cu0_local;
  int length_local;
  bool expected_local;
  
  bad_length = cu3;
  buf = (char  [4])cu2;
  cu3_local = cu1;
  cu2_local = cu0;
  cu1_local = length;
  cu0_local._3_1_ = expected;
  if (4 < length) {
    __assert_fail("length <= 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-utf8.cc"
                  ,0x1f,
                  "void (anonymous namespace)::assert_is_valid_utf8(bool, int, int, int, int, int)")
    ;
  }
  gtest_ar_.message_.ptr_._4_1_ = (undefined1)cu0;
  gtest_ar_.message_.ptr_._5_1_ = (undefined1)cu1;
  gtest_ar_.message_.ptr_._6_1_ = (undefined1)cu2;
  gtest_ar_.message_.ptr_._7_1_ = (undefined1)cu3;
  if (expected) {
    for (gtest_ar_.message_.ptr_._0_4_ = 1; (int)gtest_ar_.message_.ptr_ < cu1_local;
        gtest_ar_.message_.ptr_._0_4_ = (int)gtest_ar_.message_.ptr_ + 1) {
      bVar1 = wabt::IsValidUtf8((char *)((long)&gtest_ar_.message_.ptr_ + 4),
                                (long)(int)gtest_ar_.message_.ptr_);
      local_39 = (bool)((bVar1 ^ 0xffU) & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_38,&local_39,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
      if (!bVar1) {
        testing::Message::Message(&local_48);
        pMVar3 = testing::Message::operator<<(&local_48,&cu2_local);
        pMVar3 = testing::Message::operator<<(pMVar3,(char (*) [3])0x4e173a);
        pMVar3 = testing::Message::operator<<(pMVar3,&cu3_local);
        pMVar3 = testing::Message::operator<<(pMVar3,(char (*) [3])0x4e173a);
        pMVar3 = testing::Message::operator<<(pMVar3,(int *)buf);
        pMVar3 = testing::Message::operator<<(pMVar3,(char (*) [3])0x4e173a);
        pMVar3 = testing::Message::operator<<(pMVar3,&bad_length);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_70,(internal *)local_38,(AssertionResult *)"IsValidUtf8(buf, bad_length)",
                   "true","false",(char *)CONCAT44(in_register_0000008c,cu3));
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-utf8.cc"
                   ,0x26,pcVar4);
        testing::internal::AssertHelper::operator=(&local_50,pMVar3);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        testing::Message::~Message(&local_48);
      }
      gtest_ar__1.message_.ptr_._5_3_ = 0;
      gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
      if (gtest_ar__1.message_.ptr_._4_4_ != 0) {
        return;
      }
    }
  }
  bVar1 = (bool)(cu0_local._3_1_ & 1);
  bVar2 = wabt::IsValidUtf8((char *)((long)&gtest_ar_.message_.ptr_ + 4),(long)cu1_local);
  local_89 = bVar1 == bVar2;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_88,&local_89,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pMVar3 = testing::Message::operator<<(&local_98,&cu2_local);
    pMVar3 = testing::Message::operator<<(pMVar3,(char (*) [3])0x4e173a);
    pMVar3 = testing::Message::operator<<(pMVar3,&cu3_local);
    pMVar3 = testing::Message::operator<<(pMVar3,(char (*) [3])0x4e173a);
    pMVar3 = testing::Message::operator<<(pMVar3,(int *)buf);
    pMVar3 = testing::Message::operator<<(pMVar3,(char (*) [3])0x4e173a);
    pMVar3 = testing::Message::operator<<(pMVar3,&bad_length);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c0,(internal *)local_88,
               (AssertionResult *)"expected == IsValidUtf8(buf, length)","false","true",
               (char *)CONCAT44(in_register_0000008c,cu3));
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-utf8.cc"
               ,0x2b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_a0,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    testing::Message::~Message(&local_98);
  }
  gtest_ar__1.message_.ptr_._5_3_ = 0;
  gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  return;
}

Assistant:

void assert_is_valid_utf8(bool expected,
                          int length,
                          int cu0 = 0,
                          int cu1 = 0,
                          int cu2 = 0,
                          int cu3 = 0) {
  assert(length <= 4);
  char buf[4] = {static_cast<char>(cu0), static_cast<char>(cu1),
                 static_cast<char>(cu2), static_cast<char>(cu3)};
  if (expected) {
    // Make sure it fails if there are continuation bytes past the end of the
    // string.
    for (int bad_length = 1; bad_length < length; ++bad_length) {
      ASSERT_FALSE(IsValidUtf8(buf, bad_length))
          << cu0 << ", " << cu1 << ", " << cu2 << ", " << cu3;
    }
  }

  ASSERT_TRUE(expected == IsValidUtf8(buf, length))
      << cu0 << ", " << cu1 << ", " << cu2 << ", " << cu3;
}